

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

sherwood_v3_entry<const_slang::ast::Definition_*> *
ska::detailv3::empty_default_table<slang::ast::Definition_const*>(void)

{
  int iVar1;
  
  if ((empty_default_table<slang::ast::Definition_const*>()::result == '\0') &&
     (iVar1 = __cxa_guard_acquire(&empty_default_table<slang::ast::Definition_const*>()::result),
     iVar1 != 0)) {
    empty_default_table<const_slang::ast::Definition_*>::result[0].distance_from_desired = -1;
    empty_default_table<const_slang::ast::Definition_*>::result[1].distance_from_desired = -1;
    empty_default_table<const_slang::ast::Definition_*>::result[2].distance_from_desired = -1;
    empty_default_table<const_slang::ast::Definition_*>::result[3].distance_from_desired = '\0';
    __cxa_guard_release(&empty_default_table<slang::ast::Definition_const*>()::result);
  }
  return empty_default_table<const_slang::ast::Definition_*>::result;
}

Assistant:

sherwood_v3_entry<T> * empty_default_table()
{
    static constexpr int8_t special_end_value = 0;
    static sherwood_v3_entry<T> result[min_lookups] = { {}, {}, {}, {special_end_value} };
    return result;
}